

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O1

UBool __thiscall
icu_63::FCDUTF16CollationIterator::operator==
          (FCDUTF16CollationIterator *this,CollationIterator *other)

{
  UBool UVar1;
  UChar *pUVar2;
  long lVar3;
  bool bVar4;
  
  UVar1 = CollationIterator::operator==((CollationIterator *)this,other);
  if ((UVar1 == '\0') || (this->checkDir != (char)other[1].ceBuffer.buffer.stackArray[10])) {
LAB_00220713:
    bVar4 = false;
  }
  else {
    if (this->checkDir == '\0') {
      if (((this->super_UTF16CollationIterator).start == this->segmentStart) ==
          (other[1].super_UObject._vptr_UObject != (_func_int **)other[1].ceBuffer.buffer.ptr))
      goto LAB_00220713;
      pUVar2 = (this->super_UTF16CollationIterator).start;
      if (pUVar2 == this->segmentStart) goto LAB_0022068e;
      lVar3 = 0x188;
      if ((long)this->segmentStart - (long)this->rawStart !=
          (long)other[1].ceBuffer.buffer.ptr - *(long *)&other[1].ceBuffer) goto LAB_00220713;
    }
    else {
LAB_0022068e:
      pUVar2 = this->rawStart;
      lVar3 = 0x1a0;
    }
    bVar4 = (long)(this->super_UTF16CollationIterator).pos - (long)pUVar2 ==
            (long)other[1].trie -
            *(long *)((long)(other->ceBuffer).buffer.stackArray + lVar3 + -0x30);
  }
  return bVar4;
}

Assistant:

UBool
FCDUTF16CollationIterator::operator==(const CollationIterator &other) const {
    // Skip the UTF16CollationIterator and call its parent.
    if(!CollationIterator::operator==(other)) { return FALSE; }
    const FCDUTF16CollationIterator &o = static_cast<const FCDUTF16CollationIterator &>(other);
    // Compare the iterator state but not the text: Assume that the caller does that.
    if(checkDir != o.checkDir) { return FALSE; }
    if(checkDir == 0 && (start == segmentStart) != (o.start == o.segmentStart)) { return FALSE; }
    if(checkDir != 0 || start == segmentStart) {
        return (pos - rawStart) == (o.pos - o.rawStart);
    } else {
        return (segmentStart - rawStart) == (o.segmentStart - o.rawStart) &&
                (pos - start) == (o.pos - o.start);
    }
}